

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall absl::SimpleAtob(absl *this,string_view str,Nonnull<bool_*> out)

{
  bool bVar1;
  char cVar2;
  string_view piece2;
  string_view piece2_00;
  string_view piece2_01;
  string_view piece2_02;
  string_view piece2_03;
  string_view piece2_04;
  string_view piece2_05;
  string_view piece2_06;
  string_view piece2_07;
  string_view piece2_08;
  string_view piece1;
  string_view piece1_00;
  string_view piece1_01;
  string_view piece1_02;
  string_view piece1_03;
  string_view piece1_04;
  string_view piece1_05;
  string_view piece1_06;
  string_view piece1_07;
  string_view piece1_08;
  
  piece1._M_str = (char *)str._M_len;
  if (str._M_str == (char *)0x0) {
    raw_log_internal::RawLog
              (kFatal,"numbers.cc",0x70,"Check %s failed: %s","out != nullptr",
               "Output pointer must not be nullptr.");
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                  ,0x70,"bool absl::SimpleAtob(absl::string_view, absl::Nonnull<bool *>)");
  }
  piece2._M_str = "true";
  piece2._M_len = 4;
  piece1._M_len = (size_t)this;
  bVar1 = EqualsIgnoreCase(piece1,piece2);
  cVar2 = '\x01';
  if ((((!bVar1) &&
       (piece2_00._M_str = "t", piece2_00._M_len = 1, piece1_00._M_str = piece1._M_str,
       piece1_00._M_len = (size_t)this, bVar1 = EqualsIgnoreCase(piece1_00,piece2_00), !bVar1)) &&
      (piece2_01._M_str = "yes", piece2_01._M_len = 3, piece1_01._M_str = piece1._M_str,
      piece1_01._M_len = (size_t)this, bVar1 = EqualsIgnoreCase(piece1_01,piece2_01), !bVar1)) &&
     ((piece2_02._M_str = "y", piece2_02._M_len = 1, piece1_02._M_str = piece1._M_str,
      piece1_02._M_len = (size_t)this, bVar1 = EqualsIgnoreCase(piece1_02,piece2_02), !bVar1 &&
      (piece2_03._M_str = "1", piece2_03._M_len = 1, piece1_03._M_str = piece1._M_str,
      piece1_03._M_len = (size_t)this, bVar1 = EqualsIgnoreCase(piece1_03,piece2_03), !bVar1)))) {
    piece2_04._M_str = "false";
    piece2_04._M_len = 5;
    piece1_04._M_str = piece1._M_str;
    piece1_04._M_len = (size_t)this;
    bVar1 = EqualsIgnoreCase(piece1_04,piece2_04);
    if (((bVar1) ||
        ((piece2_05._M_str = "f", piece2_05._M_len = 1, piece1_05._M_str = piece1._M_str,
         piece1_05._M_len = (size_t)this, bVar1 = EqualsIgnoreCase(piece1_05,piece2_05), bVar1 ||
         (piece2_06._M_str = "no", piece2_06._M_len = 2, piece1_06._M_str = piece1._M_str,
         piece1_06._M_len = (size_t)this, bVar1 = EqualsIgnoreCase(piece1_06,piece2_06), bVar1))))
       || (piece2_07._M_str = "n", piece2_07._M_len = 1, piece1_07._M_str = piece1._M_str,
          piece1_07._M_len = (size_t)this, bVar1 = EqualsIgnoreCase(piece1_07,piece2_07), bVar1)) {
      cVar2 = '\0';
    }
    else {
      piece2_08._M_str = "0";
      piece2_08._M_len = 1;
      piece1_08._M_str = piece1._M_str;
      piece1_08._M_len = (size_t)this;
      bVar1 = EqualsIgnoreCase(piece1_08,piece2_08);
      cVar2 = '\0';
      if (!bVar1) {
        return false;
      }
    }
  }
  *str._M_str = cVar2;
  return true;
}

Assistant:

bool SimpleAtob(absl::string_view str, absl::Nonnull<bool*> out) {
  ABSL_RAW_CHECK(out != nullptr, "Output pointer must not be nullptr.");
  if (EqualsIgnoreCase(str, "true") || EqualsIgnoreCase(str, "t") ||
      EqualsIgnoreCase(str, "yes") || EqualsIgnoreCase(str, "y") ||
      EqualsIgnoreCase(str, "1")) {
    *out = true;
    return true;
  }
  if (EqualsIgnoreCase(str, "false") || EqualsIgnoreCase(str, "f") ||
      EqualsIgnoreCase(str, "no") || EqualsIgnoreCase(str, "n") ||
      EqualsIgnoreCase(str, "0")) {
    *out = false;
    return true;
  }
  return false;
}